

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.cpp
# Opt level: O0

void __thiscall Assimp::Blender::DNA::DumpToFile(DNA *this)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  reference pSVar4;
  reference pFVar5;
  Logger *pLVar6;
  Field *ff;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Assimp::Blender::Field> *__range2;
  Structure *s;
  iterator __end1;
  iterator __begin1;
  vector<Assimp::Blender::Structure> *__range1;
  ostream local_210 [8];
  ofstream f;
  DNA *this_local;
  
  ::std::ofstream::ofstream(local_210,"dna.txt",_S_out);
  bVar1 = ::std::ios::fail();
  if ((bVar1 & 1) == 0) {
    poVar3 = ::std::operator<<(local_210,"Field format: type name offset size");
    ::std::operator<<(poVar3,"\n");
    poVar3 = ::std::operator<<(local_210,"Structure format: name size");
    ::std::operator<<(poVar3,"\n");
    __end1 = ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
             ::begin(&(this->structures).
                      super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                    );
    s = (Structure *)
        ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::end
                  (&(this->structures).
                    super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                  );
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<Assimp::Blender::Structure_*,_std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>_>
                                  *)&s);
      if (!bVar2) break;
      pSVar4 = __gnu_cxx::
               __normal_iterator<Assimp::Blender::Structure_*,_std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>_>
               ::operator*(&__end1);
      poVar3 = ::std::operator<<(local_210,(string *)pSVar4);
      poVar3 = ::std::operator<<(poVar3," ");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,pSVar4->size);
      ::std::operator<<(poVar3,"\n\n");
      __end2 = ::std::vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>::begin
                         (&(pSVar4->fields).
                           super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
                         );
      ff = (Field *)::std::vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>::
                    end(&(pSVar4->fields).
                         super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
                       );
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<const_Assimp::Blender::Field_*,_std::vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>_>
                                    *)&ff);
        if (!bVar2) break;
        pFVar5 = __gnu_cxx::
                 __normal_iterator<const_Assimp::Blender::Field_*,_std::vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>_>
                 ::operator*(&__end2);
        poVar3 = ::std::operator<<(local_210,"\t");
        poVar3 = ::std::operator<<(poVar3,(string *)&pFVar5->type);
        poVar3 = ::std::operator<<(poVar3," ");
        poVar3 = ::std::operator<<(poVar3,(string *)pFVar5);
        poVar3 = ::std::operator<<(poVar3," ");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,pFVar5->offset);
        poVar3 = ::std::operator<<(poVar3," ");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,pFVar5->size);
        ::std::operator<<(poVar3,"\n");
        __gnu_cxx::
        __normal_iterator<const_Assimp::Blender::Field_*,_std::vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>_>
        ::operator++(&__end2);
      }
      ::std::operator<<(local_210,"\n");
      __gnu_cxx::
      __normal_iterator<Assimp::Blender::Structure_*,_std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>_>
      ::operator++(&__end1);
    }
    ::std::ostream::operator<<(local_210,::std::flush<char,std::char_traits<char>>);
    pLVar6 = DefaultLogger::get();
    Logger::info(pLVar6,"BlenderDNA: Dumped dna to dna.txt");
  }
  else {
    pLVar6 = DefaultLogger::get();
    Logger::error(pLVar6,"Could not dump dna to dna.txt");
  }
  ::std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void DNA :: DumpToFile()
{
    // we don't bother using the VFS here for this is only for debugging.
    // (and all your bases are belong to us).

    std::ofstream f("dna.txt");
    if (f.fail()) {
        ASSIMP_LOG_ERROR("Could not dump dna to dna.txt");
        return;
    }
    f << "Field format: type name offset size" << "\n";
    f << "Structure format: name size" << "\n";

    for(const Structure& s : structures) {
        f << s.name << " " << s.size << "\n\n";
        for(const Field& ff : s.fields) {
            f << "\t" << ff.type << " " << ff.name << " " << ff.offset << " " << ff.size << "\n";
        }
        f << "\n";
    }
    f << std::flush;

    ASSIMP_LOG_INFO("BlenderDNA: Dumped dna to dna.txt");
}